

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Aggregate_State_PDU::SetSilentEntitySystemList
          (Aggregate_State_PDU *this,
          vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
          *SES)

{
  bool bVar1;
  KUINT16 KVar2;
  pointer pSVar3;
  size_type sVar4;
  __normal_iterator<KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
  local_50;
  __normal_iterator<KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
  local_48;
  SilentEntitySystem *local_40;
  __normal_iterator<KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
  local_38;
  __normal_iterator<const_KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
  local_30;
  const_iterator citrEnd;
  __normal_iterator<const_KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
  local_20;
  const_iterator citr;
  vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  *SES_local;
  Aggregate_State_PDU *this_local;
  
  citr._M_current = (SilentEntitySystem *)SES;
  citrEnd._M_current =
       (SilentEntitySystem *)
       std::
       vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
       ::begin(&this->m_vSESL);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::SilentEntitySystem_const*,std::vector<KDIS::DATA_TYPE::SilentEntitySystem,std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>>>
  ::__normal_iterator<KDIS::DATA_TYPE::SilentEntitySystem*>
            ((__normal_iterator<KDIS::DATA_TYPE::SilentEntitySystem_const*,std::vector<KDIS::DATA_TYPE::SilentEntitySystem,std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>>>
              *)&local_20,
             (__normal_iterator<KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
              *)&citrEnd);
  local_38._M_current =
       (SilentEntitySystem *)
       std::
       vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
       ::end(&this->m_vSESL);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::SilentEntitySystem_const*,std::vector<KDIS::DATA_TYPE::SilentEntitySystem,std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>>>
  ::__normal_iterator<KDIS::DATA_TYPE::SilentEntitySystem*>
            ((__normal_iterator<KDIS::DATA_TYPE::SilentEntitySystem_const*,std::vector<KDIS::DATA_TYPE::SilentEntitySystem,std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>>>
              *)&local_30,&local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
             ::operator->(&local_20);
    KVar2 = DATA_TYPE::SilentEntitySystem::GetNumberOfAppearanceRecords(pSVar3);
    (this->super_Header).super_Header6.m_ui16PDULength =
         (this->super_Header).super_Header6.m_ui16PDULength - (KVar2 * 4 + 0xc);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
    ::operator++(&local_20);
  }
  std::
  vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  ::operator=(&this->m_vSESL,
              (vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
               *)citr._M_current);
  local_48._M_current =
       (SilentEntitySystem *)
       std::
       vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
       ::begin(&this->m_vSESL);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::SilentEntitySystem_const*,std::vector<KDIS::DATA_TYPE::SilentEntitySystem,std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>>>
  ::__normal_iterator<KDIS::DATA_TYPE::SilentEntitySystem*>
            ((__normal_iterator<KDIS::DATA_TYPE::SilentEntitySystem_const*,std::vector<KDIS::DATA_TYPE::SilentEntitySystem,std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>>>
              *)&local_40,&local_48);
  local_20._M_current = local_40;
  while( true ) {
    local_50._M_current =
         (SilentEntitySystem *)
         std::
         vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
         ::end(&this->m_vSESL);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_50);
    if (!bVar1) break;
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
             ::operator->(&local_20);
    KVar2 = DATA_TYPE::SilentEntitySystem::GetNumberOfAppearanceRecords(pSVar3);
    (this->super_Header).super_Header6.m_ui16PDULength =
         (this->super_Header).super_Header6.m_ui16PDULength + KVar2 * 4 + 0xc;
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
    ::operator++(&local_20);
  }
  sVar4 = std::
          vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
          ::size(&this->m_vSESL);
  this->m_ui16NumSilentEntityTypes = (KUINT16)sVar4;
  return;
}

Assistant:

void Aggregate_State_PDU::SetSilentEntitySystemList( const vector<SilentEntitySystem> & SES )
{
    // Reset the PDU length
    vector<SilentEntitySystem>::const_iterator citr = m_vSESL.begin();
    vector<SilentEntitySystem>::const_iterator citrEnd = m_vSESL.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength -= SilentEntitySystem::SILENT_ENTITY_SYSTEM_SIZE + ( citr->GetNumberOfAppearanceRecords() * EntityAppearance::ENTITY_APPEARANCE_SIZE );
    }

    m_vSESL = SES;

    for( citr = m_vSESL.begin(); citr!= m_vSESL.end(); ++citr )
    {
        m_ui16PDULength += SilentEntitySystem::SILENT_ENTITY_SYSTEM_SIZE + ( citr->GetNumberOfAppearanceRecords() * EntityAppearance::ENTITY_APPEARANCE_SIZE );
    }

    m_ui16NumSilentEntityTypes = m_vSESL.size();
}